

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O0

void __thiscall QSslCipher::QSslCipher(QSslCipher *this)

{
  QSslCipherPrivate *this_00;
  pointer in_RDI;
  
  this_00 = (QSslCipherPrivate *)operator_new(0x98);
  QSslCipherPrivate::QSslCipherPrivate(this_00);
  std::unique_ptr<QSslCipherPrivate,std::default_delete<QSslCipherPrivate>>::
  unique_ptr<std::default_delete<QSslCipherPrivate>,void>
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)this_00,
             in_RDI);
  return;
}

Assistant:

QSslCipher::QSslCipher()
    : d(new QSslCipherPrivate)
{
}